

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

DImpactDecal *
DImpactDecal::StaticCreate
          (FDecalTemplate *tpl,DVector3 *pos,side_t *wall,F3DFloor *ffloor,PalEntry color)

{
  int iVar1;
  FTextureID FVar2;
  undefined4 extraout_var;
  DBaseDecal *this;
  uint r;
  uint g;
  anon_union_4_2_12391d7c_for_PalEntry_0 color_00;
  
  if (((tpl != (FDecalTemplate *)0x0) && (0 < cl_maxdecals.Value)) && ((wall->Flags & 2) == 0)) {
    if (tpl->LowerDecal != (FDecalBase *)0x0) {
      iVar1 = (**tpl->LowerDecal->_vptr_FDecalBase)();
      color_00.d = 0;
      if (tpl->ShadeColor == ((FDecalTemplate *)CONCAT44(extraout_var,iVar1))->ShadeColor) {
        color_00 = color.field_0;
      }
      StaticCreate((FDecalTemplate *)CONCAT44(extraout_var,iVar1),pos,wall,ffloor,
                   (PalEntry)color_00.field_0);
    }
    CheckMax();
    this = (DBaseDecal *)DObject::operator_new(0x98);
    DImpactDecal((DImpactDecal *)this,pos->Z);
    FVar2 = DBaseDecal::StickToWall(this,wall,pos->X,pos->Y,ffloor);
    if (0 < FVar2.texnum) {
      FDecalTemplate::ApplyToDecal(tpl,this,wall);
      r = (uint)color.field_0 >> 0x10 & 0xff;
      g = (uint)color.field_0 >> 8 & 0xff;
      if ((g != 0 || (r != 0 || ((uint)color.field_0 & 0xff000000) != 0)) ||
          ((uint)color.field_0 & 0xff) != 0) {
        DBaseDecal::SetShade(this,r,g,(uint)color.field_0 & 0xff);
      }
      if (cl_spreaddecals.Value == true) {
        if (0 < (this->PicNum).texnum) {
          DBaseDecal::Spread(this,tpl,wall,pos->X,pos->Y,pos->Z,ffloor);
          return (DImpactDecal *)this;
        }
        return (DImpactDecal *)this;
      }
      return (DImpactDecal *)this;
    }
  }
  return (DImpactDecal *)0x0;
}

Assistant:

DImpactDecal *DImpactDecal::StaticCreate (const FDecalTemplate *tpl, const DVector3 &pos, side_t *wall, F3DFloor * ffloor, PalEntry color)
{
	DImpactDecal *decal = NULL;
	if (tpl != NULL && cl_maxdecals > 0 && !(wall->Flags & WALLF_NOAUTODECALS))
	{
		if (tpl->LowerDecal)
		{
			int lowercolor;
			const FDecalTemplate * tpl_low = tpl->LowerDecal->GetDecal();

			// If the default color of the lower decal is the same as the main decal's
			// apply the custom color as well.
			if (tpl->ShadeColor != tpl_low->ShadeColor) lowercolor=0;
			else lowercolor = color;
			StaticCreate (tpl_low, pos, wall, ffloor, lowercolor);
		}
		DImpactDecal::CheckMax();
		decal = new DImpactDecal (pos.Z);
		if (decal == NULL)
		{
			return NULL;
		}

		if (!decal->StickToWall (wall, pos.X, pos.Y, ffloor).isValid())
		{
			return NULL;
		}

		tpl->ApplyToDecal (decal, wall);
		if (color != 0)
		{
			decal->SetShade (color.r, color.g, color.b);
		}

		if (!cl_spreaddecals || !decal->PicNum.isValid())
		{
			return decal;
		}

		// Spread decal to nearby walls if it does not all fit on this one
		decal->Spread (tpl, wall, pos.X, pos.Y, pos.Z, ffloor);
	}
	return decal;
}